

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalableKReach.cpp
# Opt level: O3

void __thiscall
ScalableKReach::ScalableKReach
          (ScalableKReach *this,Graph *graph,distance_t k,uint32_t b1,uint32_t b2)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  degree_t dVar4;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  quedeg_temp_;
  less<std::pair<unsigned_int,_unsigned_int>_> local_79;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_78;
  priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
  local_58;
  
  (this->super_AbstractKReach)._vptr_AbstractKReach = (_func_int **)&PTR_construct_00112d10;
  this->graph_ = graph;
  this->k_ = k;
  (this->D1_).parent_ = this;
  (this->D1_).graph_ = graph;
  (this->D1_).k_ = k;
  (this->D1_).budget_ = b1;
  (this->D1_).isD2_ = false;
  (this->D1_).succ_._M_h._M_buckets = &(this->D1_).succ_._M_h._M_single_bucket;
  (this->D1_).succ_._M_h._M_bucket_count = 1;
  (this->D1_).succ_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->D1_).succ_._M_h._M_element_count = 0;
  (this->D1_).succ_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->D1_).succ_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->D1_).succ_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->D1_).pred_._M_h._M_buckets = &(this->D1_).pred_._M_h._M_single_bucket;
  (this->D1_).pred_._M_h._M_bucket_count = 1;
  (this->D1_).pred_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->D1_).pred_._M_h._M_element_count = 0;
  (this->D1_).pred_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->D1_).pred_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->D1_).pred_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->D1_).quedeg_ = &this->quedeg_;
  this_00 = &this->degree_;
  (this->D1_).degree_ = this_00;
  this_01 = &this->queue_;
  (this->D1_).queue_ = this_01;
  (this->D2_).parent_ = this;
  (this->D2_).graph_ = graph;
  (this->D2_).k_ = k;
  (this->D2_).budget_ = b2;
  (this->D2_).isD2_ = true;
  (this->D2_).succ_._M_h._M_buckets = &(this->D2_).succ_._M_h._M_single_bucket;
  (this->D2_).succ_._M_h._M_bucket_count = 1;
  (this->D2_).succ_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->D2_).succ_._M_h._M_element_count = 0;
  (this->D2_).succ_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->D2_).succ_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->D2_).succ_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->D2_).pred_._M_h._M_buckets = &(this->D2_).pred_._M_h._M_single_bucket;
  (this->D2_).pred_._M_h._M_bucket_count = 1;
  (this->D2_).pred_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->D2_).pred_._M_h._M_element_count = 0;
  (this->D2_).pred_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->D2_).pred_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->D2_).pred_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->D2_).quedeg_ = &this->quedeg_;
  (this->D2_).degree_ = this_00;
  (this->D2_).queue_ = this_01;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar4 = Graph::num_vertices(graph);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this_00,(ulong)dVar4,(allocator_type *)&local_58);
  dVar4 = Graph::num_vertices(graph);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->distance_,(ulong)dVar4,"?14ScalableKReach",(allocator_type *)&local_58);
  dVar4 = Graph::num_vertices(graph);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this_01,(ulong)dVar4,(allocator_type *)&local_58);
  local_78.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar4 = Graph::num_vertices(graph);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::reserve(&local_78,(ulong)dVar4);
  std::
  priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
  ::priority_queue(&local_58,&local_79,&local_78);
  ppVar1 = (this->quedeg_).c.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->quedeg_).c.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar3 = (this->quedeg_).c.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.c.
       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.c.
       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->quedeg_).c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.c.
       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = ppVar1;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar3;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)ppVar3 - (long)ppVar1);
  }
  if (local_78.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ScalableKReach::ScalableKReach(const Graph &graph, distance_t k, uint32_t b1, uint32_t b2)
        : graph_(graph), k_(k), D1_(*this, graph, k, b1), D2_(*this, graph, k, b2, true),
          degree_(graph.num_vertices()), distance_(graph.num_vertices(), INF8), queue_(graph.num_vertices()) {
    vector<pair<degree_t, vertex_t>> quedeg_temp_;
    quedeg_temp_.reserve(graph.num_vertices());
    DegreeQueue(less<pair<degree_t, vertex_t>>(), move(quedeg_temp_)).swap(quedeg_);
}